

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O2

void __thiscall ParameterReader::setVal(ParameterReader *this,string *name,double value)

{
  long lVar1;
  double local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_e8 = value;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  lVar1 = _find(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    AfterburnerUtil::trim(&local_a0,&local_60);
    AfterburnerUtil::toLower(&local_e0,&local_a0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::vector<double,_std::allocator<double>_>::push_back(&this->values,&local_e8);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)name);
    AfterburnerUtil::trim(&local_c0,&local_80);
    AfterburnerUtil::toLower(&local_e0,&local_c0);
    std::__cxx11::string::operator=
              ((string *)
               ((this->names).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar1),(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    (this->values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar1] = value;
  }
  return;
}

Assistant:

void ParameterReader::setVal(string name, double value) {
    /*
      Set the parameter with "name" to "value". It is appended to the
      internal "names" and "values" vector if "name" does not exist;
      otherwise it is rewitten.
    */
    long idx = _find(name);
    if (idx == -1) {
        names.push_back(toLower(trim(name)));
        values.push_back(value);
    } else {
        names[idx] = toLower(trim(name));
        values[idx] = value;
    }
}